

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin.c
# Opt level: O2

_Bool bin_init(bin_t *bin)

{
  _Bool _Var1;
  
  _Var1 = malloc_mutex_init(&bin->lock,"bin",0xffffffff,malloc_mutex_rank_exclusive);
  if (!_Var1) {
    bin->slabcur = (extent_t *)0x0;
    extent_heap_new(&bin->slabs_nonfull);
    memset(&bin->slabs_full,0,0x98);
  }
  return _Var1;
}

Assistant:

bool
bin_init(bin_t *bin) {
	if (malloc_mutex_init(&bin->lock, "bin", WITNESS_RANK_BIN,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	bin->slabcur = NULL;
	extent_heap_new(&bin->slabs_nonfull);
	extent_list_init(&bin->slabs_full);
	if (config_stats) {
		memset(&bin->stats, 0, sizeof(bin_stats_t));
	}
	return false;
}